

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsComponentCompare(FmsComponent lhs,FmsComponent rhs)

{
  FmsIntType itype;
  FmsInt size;
  _FmsPart_private *p_Var1;
  _FmsPart_private *p_Var2;
  uint uVar3;
  int iVar4;
  FmsInt FVar5;
  FmsInt FVar6;
  FmsInt FVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (FmsComponent)0x0) {
    uVar8 = 0xffffffff;
  }
  else if (rhs == (FmsComponent)0x0) {
    uVar8 = 0xfffffffe;
  }
  else {
    if (lhs->name == (char *)0x0) {
      uVar8 = 2;
    }
    else if (rhs->name == (char *)0x0) {
      uVar8 = 3;
    }
    else {
      iVar4 = strcmp(lhs->name,rhs->name);
      uVar8 = (uint)(iVar4 != 0);
    }
    uVar3 = uVar8 + 10;
    if (lhs->id == rhs->id) {
      uVar3 = uVar8;
    }
    uVar8 = uVar3 + 100;
    if (lhs->dim == rhs->dim) {
      uVar8 = uVar3;
    }
    uVar3 = uVar8 + 1000;
    if (lhs->num_main_entities == rhs->num_main_entities) {
      uVar3 = uVar8;
    }
    FVar7 = lhs->num_parts;
    uVar9 = uVar3 + 2000;
    if (FVar7 == rhs->num_parts) {
      uVar9 = uVar3;
    }
    size = lhs->num_relations;
    uVar8 = uVar9 + 3000;
    if (size == rhs->num_relations) {
      uVar8 = uVar9;
    }
    if (uVar8 == 0) {
      lVar11 = 0;
      for (FVar6 = 0; FVar6 != FVar7; FVar6 = FVar6 + 1) {
        p_Var1 = lhs->parts;
        p_Var2 = rhs->parts;
        iVar4 = FmsDomainCompare(p_Var1[FVar6].domain,p_Var2[FVar6].domain);
        if (iVar4 != 0) {
          return 10000;
        }
        lVar10 = 0;
        while (lVar10 != 0x20) {
          FVar5 = *(FmsInt *)((long)p_Var1->num_entities + lVar10 * 2 + lVar11);
          if (FVar5 != *(FmsInt *)((long)p_Var2->num_entities + lVar10 * 2 + lVar11)) {
            return 20000;
          }
          itype = *(FmsIntType *)((long)p_Var1->entities_ids_type + lVar10 + lVar11);
          if (itype != *(FmsIntType *)((long)p_Var2->entities_ids_type + lVar10 + lVar11)) {
            return 30000;
          }
          FVar5 = CompareIntData(itype,FVar5,
                                 *(void **)((long)p_Var1->entities_ids + lVar10 * 2 + lVar11),
                                 *(void **)((long)p_Var2->entities_ids + lVar10 * 2 + lVar11));
          lVar10 = lVar10 + 4;
          if (FVar5 != 0) {
            return 40000;
          }
        }
        lVar11 = lVar11 + 0xe8;
      }
      FVar7 = CompareIntData(FMS_INT_TYPE,size,lhs->relations,rhs->relations);
      uVar8 = 50000;
      if (FVar7 == 0) {
        iVar4 = FmsFieldCompare(lhs->coordinates,rhs->coordinates);
        uVar8 = 60000;
        if (iVar4 == 0) {
          uVar8 = 0;
        }
      }
    }
  }
  return uVar8;
}

Assistant:

int FmsComponentCompare(FmsComponent lhs, FmsComponent rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;

  if(lhs->id != rhs->id)
    diff += 10;

  if(lhs->dim != rhs->dim)
    diff += 100;

  if(lhs->num_main_entities != rhs->num_main_entities)
    diff += 1000;

  if(lhs->num_parts != rhs->num_parts)
    diff += 2000;

  if(lhs->num_relations != rhs->num_relations)
    diff += 3000;

  if(diff == 0) {
    const FmsInt np = lhs->num_parts;
    for(FmsInt i = 0; i < np; i++) {
      const struct _FmsPart_private *lpart = &lhs->parts[i];
      const struct _FmsPart_private *rpart = &rhs->parts[i];
      if(FmsDomainCompare(lpart->domain, rpart->domain)) {
        diff += 10000;
        break;
      }
      for(FmsInt j = 0; j < FMS_NUM_ENTITY_TYPES; j++) {
        if(lpart->num_entities[j] != rpart->num_entities[j]) {
          diff += 20000;
          break;
        }
        if(lpart->entities_ids_type[j] != rpart->entities_ids_type[j]) {
          diff += 30000;
          break;
        }
        if(CompareIntData(lpart->entities_ids_type[j],
                          lpart->num_entities[j],
                          lpart->entities_ids[j], rpart->entities_ids[j])) {
          diff += 40000;
          break;
        }
      }
      if(diff)
        break;
    }
  }

  if(diff == 0) {
    if(CompareIntData(FMS_INT_TYPE, lhs->num_relations, lhs->relations,
                      rhs->relations))
      diff += 50000;
  }

  if(diff == 0) {
    // Ensure they refer to the same coordinates field
    if(FmsFieldCompare(lhs->coordinates, rhs->coordinates))
      diff += 60000;
  }

  return diff;
}